

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O3

Gia_Man_t * Gia_ManPerformBidec(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vTruth;
  int *piVar3;
  Vec_Int_t *vVisited;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Bdc_Man_t *pManDec;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_01;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  Gia_Obj_t *pGVar16;
  Bdc_Par_t local_54;
  Gia_Man_t *local_48;
  Gia_Obj_t *local_40;
  long local_38;
  
  local_54.fVeryVerbose = 0;
  local_54.nVarsMax = Gia_ManLutSizeMax(p);
  local_54.fVerbose = fVerbose;
  if (local_54.nVarsMax < 2) {
    pcVar11 = "Resynthesis is not performed when nodes have less than 2 inputs.";
  }
  else {
    if ((uint)local_54.nVarsMax < 0x10) {
      vLeaves = (Vec_Int_t *)calloc(1,0x10);
      vTruth = (Vec_Int_t *)malloc(0x10);
      vTruth->nCap = 0x10000;
      vTruth->nSize = 0;
      piVar3 = (int *)malloc(0x40000);
      vTruth->pArray = piVar3;
      vVisited = (Vec_Int_t *)calloc(1,0x10);
      Gia_ManCleanTruth(p);
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      p_00 = Gia_ManStart(p->nObjs);
      pcVar11 = p->pName;
      if (pcVar11 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar4 = strlen(pcVar11);
        pcVar5 = (char *)malloc(sVar4 + 1);
        strcpy(pcVar5,pcVar11);
      }
      p_00->pName = pcVar5;
      pcVar11 = p->pSpec;
      if (pcVar11 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar4 = strlen(pcVar11);
        pcVar5 = (char *)malloc(sVar4 + 1);
        strcpy(pcVar5,pcVar11);
      }
      p_00->pSpec = pcVar5;
      Gia_ManHashAlloc(p_00);
      pManDec = Bdc_ManAlloc(&local_54);
      if (1 < p->nObjs) {
        lVar10 = 1;
        lVar14 = 0xc;
        local_48 = p;
        do {
          pGVar16 = p->pObjs;
          uVar15 = (uint)*(ulong *)(&pGVar16->field_0x0 + lVar14);
          if ((uVar15 & 0x9fffffff) == 0x9fffffff) {
            pGVar6 = Gia_ManAppendObj(p_00);
            uVar7 = *(ulong *)pGVar6;
            *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
            *(ulong *)pGVar6 =
                 uVar7 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar8 = p_00->pObjs;
            if ((pGVar6 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar6)) {
LAB_0070ed77:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar8) >> 2) * -0x55555555);
            pGVar8 = p_00->pObjs;
            if ((pGVar6 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar6)) goto LAB_0070ed77;
            iVar2 = (int)((ulong)((long)pGVar6 - (long)pGVar8) >> 2) * 0x55555556;
LAB_0070ec7a:
            *(int *)((long)&pGVar16->Value + lVar14) = iVar2;
          }
          else {
            uVar7 = *(ulong *)(&pGVar16->field_0x0 + lVar14) & 0x1fffffff;
            if (uVar7 != 0x1fffffff && (int)uVar15 < 0) {
              uVar1 = *(uint *)((long)pGVar16 + lVar14 + (ulong)(uint)((int)uVar7 << 2) * -3 + 8);
              local_38 = lVar10;
              if ((int)uVar1 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar12 = uVar1 >> 1;
              if (p_00->nObjs <= (int)uVar12) {
                __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
              }
              local_40 = pGVar16;
              if ((~*(uint *)(p_00->pObjs + uVar12) & 0x1fffffff) != 0 &&
                  (int)*(uint *)(p_00->pObjs + uVar12) < 0) {
                __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
              }
              pGVar8 = Gia_ManAppendObj(p_00);
              uVar7 = *(ulong *)pGVar8;
              *(ulong *)pGVar8 = uVar7 | 0x80000000;
              pGVar16 = p_00->pObjs;
              if ((pGVar8 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar8)) goto LAB_0070ed77;
              uVar9 = (ulong)(((uint)((int)pGVar8 - (int)pGVar16) >> 2) * -0x55555555 - uVar12 &
                             0x1fffffff);
              uVar13 = (ulong)((uVar1 << 0x1d ^ uVar15) & 0x20000000);
              *(ulong *)pGVar8 = uVar13 | uVar7 & 0xffffffffc0000000 | 0x80000000 | uVar9;
              *(ulong *)pGVar8 =
                   uVar13 | uVar7 & 0xe0000000c0000000 | 0x80000000 | uVar9 |
                   (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
              pGVar16 = p_00->pObjs;
              if ((pGVar8 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar8)) goto LAB_0070ed77;
              Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar8 - (long)pGVar16) >> 2) * -0x55555555
                         );
              lVar10 = local_38;
              p = local_48;
              if (p_00->pFanData != (int *)0x0) {
                Gia_ObjAddFanout(p_00,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),
                                 pGVar8);
              }
              pGVar16 = p_00->pObjs;
              if ((pGVar8 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar8)) goto LAB_0070ed77;
              iVar2 = (int)((ulong)((long)pGVar8 - (long)pGVar16) >> 2) * 0x55555556;
              pGVar16 = local_40;
              goto LAB_0070ec7a;
            }
            if (p->vMapping->nSize <= lVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (p->vMapping->pArray[lVar10] != 0) {
              iVar2 = Gia_ObjPerformBidec(pManDec,p_00,p,(Gia_Obj_t *)(&pGVar16->field_0x0 + lVar14)
                                          ,vLeaves,vTruth,vVisited);
              goto LAB_0070ec7a;
            }
          }
          lVar10 = lVar10 + 1;
          lVar14 = lVar14 + 0xc;
        } while (lVar10 < p->nObjs);
      }
      Bdc_ManFree(pManDec);
      Gia_ManHashStop(p_00);
      iVar2 = Gia_ManHasDangling(p_00);
      p_01 = p_00;
      if (iVar2 != 0) {
        p_01 = Gia_ManCleanup(p_00);
        if (~(p_01->vCos->nSize + p_01->vCis->nSize) + p_01->nObjs !=
            ~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs) {
          printf("Gia_ManPerformBidec() node count before and after: %6d and %6d.\n");
        }
        Gia_ManStop(p_00);
      }
      Gia_ManSetRegNum(p_01,p->nRegs);
      if (vLeaves->pArray != (int *)0x0) {
        free(vLeaves->pArray);
      }
      free(vLeaves);
      if (vTruth->pArray != (int *)0x0) {
        free(vTruth->pArray);
      }
      free(vTruth);
      if (vVisited->pArray != (int *)0x0) {
        free(vVisited->pArray);
      }
      free(vVisited);
      return p_01;
    }
    pcVar11 = "Resynthesis is not performed when nodes have more than 15 inputs.";
  }
  puts(pcVar11);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManPerformBidec( Gia_Man_t * p, int fVerbose )
{
    Bdc_Man_t * pManDec;
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;//, clk = Abc_Clock();
    pPars->nVarsMax = Gia_ManLutSizeMax( p );
    pPars->fVerbose = fVerbose;
    if ( pPars->nVarsMax < 2 )
    {
        printf( "Resynthesis is not performed when nodes have less than 2 inputs.\n" );
        return NULL;
    }
    if ( pPars->nVarsMax > 15 )
    {
        printf( "Resynthesis is not performed when nodes have more than 15 inputs.\n" );
        return NULL;
    }
    vLeaves  = Vec_IntAlloc( 0 );
    vTruth   = Vec_IntAlloc( (1<<16) );
    vVisited = Vec_IntAlloc( 0 );
    // clean the old manager
    Gia_ManCleanTruth( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
//    Gia_ManCleanLevels( pNew, Gia_ManObjNum(p) );
    pManDec = Bdc_ManAlloc( pPars );
    Gia_ManForEachObj1( p, pObj, i )
    {        
        if ( Gia_ObjIsCi(pObj) ) // transfer the CI level (is it needed?)
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsLut(p, i) )
            pObj->Value = Gia_ObjPerformBidec( pManDec, pNew, p, pObj, vLeaves, vTruth, vVisited );
    }
    Bdc_ManFree( pManDec );
    // cleanup the AIG
    Gia_ManHashStop( pNew );
    // check the presence of dangling nodes
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        if ( Gia_ManAndNum(pNew) != Gia_ManAndNum(pTemp) )
            printf( "Gia_ManPerformBidec() node count before and after: %6d and %6d.\n", Gia_ManAndNum(pNew), Gia_ManAndNum(pTemp) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    if ( fVerbose )
    {
//        printf( "Total gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pNew) );
//        ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
    return pNew;
}